

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_iterative.c
# Opt level: O0

int SUNQRAdd_DCGS2_SB(N_Vector *Q,realtype *R,N_Vector df,int m,int mMax,void *QRdata)

{
  int in_ECX;
  long in_RSI;
  int in_R8D;
  N_Vector in_R9;
  realtype rVar1;
  SUNQRData qrdata;
  sunindextype j;
  N_Vector in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  double c;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  int nvec;
  
  N_VScale((realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x1187d85);
  if (0 < in_ECX) {
    if (in_ECX == 1) {
      N_VDotProdMulti(in_stack_ffffffffffffffd4,in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                      (realtype *)in_stack_ffffffffffffffb8);
    }
    else if (1 < in_ECX) {
      N_VDotProdMultiLocal
                (in_stack_ffffffffffffffd0,in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                 (realtype *)in_stack_ffffffffffffffb8);
      N_VDotProdMultiLocal
                (in_stack_ffffffffffffffd0,in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                 (realtype *)in_stack_ffffffffffffffb8);
      N_VDotProdMultiAllReduce
                ((int)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(realtype *)0x1187e4d);
      for (nvec = 0; nvec < in_ECX; nvec = nvec + 1) {
        *(SUNProfiler *)(in_RSI + (long)(in_ECX * in_R8D + nvec) * 8) =
             (&in_R9->sunctx->profiler)[nvec];
      }
      N_VLinearCombination
                (nvec,(realtype *)in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
      N_VLinearSum((realtype)CONCAT44(nvec,in_stack_ffffffffffffffd0),in_R9,
                   (realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x1187f0c
                  );
      for (in_stack_ffffffffffffffd4 = 0; in_stack_ffffffffffffffd4 < in_ECX + -1;
          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
        *(double *)(in_RSI + (long)((in_ECX + -1) * in_R8D + in_stack_ffffffffffffffd4) * 8) =
             *(double *)(in_RSI + (long)((in_ECX + -1) * in_R8D + in_stack_ffffffffffffffd4) * 8) +
             (double)(&in_R9->sunctx->profiler)[in_ECX + in_stack_ffffffffffffffd4];
      }
    }
    N_VLinearCombination
              (in_stack_ffffffffffffffd4,(realtype *)in_R9,(N_Vector *)in_stack_ffffffffffffffc0,
               in_stack_ffffffffffffffb8);
    N_VLinearSum((realtype)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_R9,
                 (realtype)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,(N_Vector)0x1187fe3);
  }
  rVar1 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  if (0.0 < rVar1) {
    rVar1 = N_VDotProd(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    c = sqrt(rVar1);
  }
  else {
    c = 0.0;
  }
  *(double *)(in_RSI + (long)(in_ECX * in_R8D + in_ECX) * 8) = c;
  N_VScale(c,in_stack_ffffffffffffffb8,(N_Vector)0x118808c);
  return 0;
}

Assistant:

int SUNQRAdd_DCGS2_SB(N_Vector *Q, realtype *R, N_Vector df,
                      int m, int mMax, void *QRdata)
{
    sunindextype j;
    SUNQRData qrdata = (SUNQRData) QRdata;

    N_VScale(ONE, df, qrdata->vtemp); /* temp = df */

    if (m > 0) {
      if (m == 1) {
        /* R(1:k-1,k) = Q_k-1^T df_aa */
        N_VDotProdMulti(m, qrdata->vtemp, Q, R + m*mMax);
      }
      /* Delayed reorthogonalization */
      else if (m > 1) {
        /* R(1:k-1,k) = Q_k-1^T df_aa */
        /* Put R values at beginning of temp array */
        N_VDotProdMultiLocal(m, qrdata->vtemp, Q, qrdata->temp_array);

        /* s = Q_k-2^T Q(:,k-1) */
        N_VDotProdMultiLocal(m-1, Q[m-1], Q, qrdata->temp_array + m);
        N_VDotProdMultiAllReduce(m + m-1, qrdata->vtemp, qrdata->temp_array);

        /* Move R values to R */
        for (j = 0; j < m; j++) {
          R[m*mMax + j] = qrdata->temp_array[j];
        }

        /* Q(:,k-1) = Q(:,k-1) - Q_k-2 s */
        N_VLinearCombination(m-1, qrdata->temp_array + m, Q, qrdata->vtemp2);
        N_VLinearSum(ONE, Q[m-1], -ONE, qrdata->vtemp2, Q[m-1]);

        /* R(1:k-2,k-1) = R(1:k-2,k-1) + s */
        for (j = 0; j < m-1; j++) {
          R[(m-1) * mMax + j] = R[(m-1) * mMax + j] + qrdata->temp_array[m + j];
        }
      }

      /* df = df - Q(:,k-1) R(1:k-1,k) */
      N_VLinearCombination(m, R + m * mMax, Q, qrdata->vtemp2);
      N_VLinearSum(ONE, qrdata->vtemp, -ONE, qrdata->vtemp2, qrdata->vtemp);
    }

    /* R(k,k) = \| df \| */
    R[m * mMax + m] = SUNRsqrt(N_VDotProd(qrdata->vtemp, qrdata->vtemp));
    /* Q(:,k) = df / R(k,k) */
    N_VScale((1/R[m * mMax + m]), qrdata->vtemp, Q[m]);

    /* Return success */
    return 0;
}